

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3ExprAffinity(Expr *pExpr)

{
  char cVar1;
  char *in_RDI;
  int op;
  char *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  char *local_10;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  cVar1 = *in_RDI;
  local_10 = in_RDI;
  while( true ) {
    if ((cVar1 == -0x58) || ((cVar1 == -0x56 && (*(long *)(local_10 + 0x40) != 0)))) {
      cVar1 = sqlite3TableColumnAffinity
                        (*(Table **)(local_10 + 0x40),(int)*(short *)(local_10 + 0x30));
      return cVar1;
    }
    if (cVar1 == -0x75) {
      cVar1 = sqlite3ExprAffinity((Expr *)CONCAT44(0x8b,in_stack_ffffffffffffffe8));
      return cVar1;
    }
    if (cVar1 == '$') break;
    if (cVar1 == -0x4e) {
      cVar1 = sqlite3ExprAffinity((Expr *)CONCAT44(0xb2,in_stack_ffffffffffffffe8));
      return cVar1;
    }
    if (cVar1 == -0x4f) {
      cVar1 = sqlite3ExprAffinity((Expr *)CONCAT44(0xb1,in_stack_ffffffffffffffe8));
      return cVar1;
    }
    if ((*(uint *)(local_10 + 4) & 0x42000) == 0) {
      if ((cVar1 != -0x50) || (cVar1 = local_10[2], cVar1 == -0x50)) {
        return local_10[1];
      }
    }
    else {
      local_10 = *(char **)(local_10 + 0x10);
      cVar1 = *local_10;
    }
  }
  cVar1 = sqlite3AffinityType(unaff_retaddr,
                              (Column *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  return cVar1;
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(const Expr *pExpr){
  int op;
  op = pExpr->op;
  while( 1 /* exit-by-break */ ){
    if( op==TK_COLUMN || (op==TK_AGG_COLUMN && pExpr->y.pTab!=0) ){
      assert( ExprUseYTab(pExpr) );
      assert( pExpr->y.pTab!=0 );
      return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
    }
    if( op==TK_SELECT ){
      assert( ExprUseXSelect(pExpr) );
      assert( pExpr->x.pSelect!=0 );
      assert( pExpr->x.pSelect->pEList!=0 );
      assert( pExpr->x.pSelect->pEList->a[0].pExpr!=0 );
      return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
    }
#ifndef SQLITE_OMIT_CAST
    if( op==TK_CAST ){
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      return sqlite3AffinityType(pExpr->u.zToken, 0);
    }
#endif
    if( op==TK_SELECT_COLUMN ){
      assert( pExpr->pLeft!=0 && ExprUseXSelect(pExpr->pLeft) );
      assert( pExpr->iColumn < pExpr->iTable );
      assert( pExpr->iColumn >= 0 );
      assert( pExpr->iTable==pExpr->pLeft->x.pSelect->pEList->nExpr );
      return sqlite3ExprAffinity(
          pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
      );
    }
    if( op==TK_VECTOR ){
      assert( ExprUseXList(pExpr) );
      return sqlite3ExprAffinity(pExpr->x.pList->a[0].pExpr);
    }
    if( ExprHasProperty(pExpr, EP_Skip|EP_IfNullRow) ){
      assert( pExpr->op==TK_COLLATE
           || pExpr->op==TK_IF_NULL_ROW
           || (pExpr->op==TK_REGISTER && pExpr->op2==TK_IF_NULL_ROW) );
      pExpr = pExpr->pLeft;
      op = pExpr->op;
      continue;
    }
    if( op!=TK_REGISTER ) break;
    op = pExpr->op2;
    if( NEVER( op==TK_REGISTER ) ) break;
  }
  return pExpr->affExpr;
}